

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

void delete_program_code(rar_program_code *prog)

{
  rar_program_code *prVar1;
  rar_program_code *next;
  rar_program_code *prog_local;
  
  next = prog;
  while (next != (rar_program_code *)0x0) {
    prVar1 = next->next;
    free(next->staticdata);
    free(next->globalbackup);
    free(next);
    next = prVar1;
  }
  return;
}

Assistant:

static void
delete_program_code(struct rar_program_code *prog)
{
  while (prog)
  {
    struct rar_program_code *next = prog->next;
    free(prog->staticdata);
    free(prog->globalbackup);
    free(prog);
    prog = next;
  }
}